

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint uivector_resize(uivector *p,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  size_t __size;
  
  uVar1 = size * 4;
  uVar2 = p->allocsize;
  if (uVar2 <= uVar1 && uVar1 - uVar2 != 0) {
    __size = (uVar2 >> 1) + uVar1;
    puVar3 = (uint *)realloc(p->data,__size);
    if (puVar3 == (uint *)0x0) {
      return 0;
    }
    p->allocsize = __size;
    p->data = puVar3;
  }
  p->size = size;
  return 1;
}

Assistant:

static unsigned uivector_resize(uivector* p, size_t size) {
  size_t allocsize = size * sizeof(unsigned);
  if(allocsize > p->allocsize) {
    size_t newsize = allocsize + (p->allocsize >> 1u);
    void* data = lodepng_realloc(p->data, newsize);
    if(data) {
      p->allocsize = newsize;
      p->data = (unsigned*)data;
    }
    else return 0; /*error: not enough memory*/
  }
  p->size = size;
  return 1; /*success*/
}